

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::loginFailed(ChatWindow *this,QString *reason)

{
  QString *pQVar1;
  QFlags<QMessageBox::StandardButton> local_34;
  QString local_30;
  QString *local_18;
  QString *reason_local;
  ChatWindow *this_local;
  
  local_18 = reason;
  reason_local = (QString *)this;
  tr(&local_30,"Error",(char *)0x0,-1);
  pQVar1 = local_18;
  QFlags<QMessageBox::StandardButton>::QFlags(&local_34,FirstButton);
  QMessageBox::critical
            (&this->super_QWidget,(QString *)&local_30,(QString *)pQVar1,
             (QFlags_conflict1 *)(ulong)(uint)local_34.i,NoButton);
  QString::~QString(&local_30);
  connectedToServer(this);
  return;
}

Assistant:

void ChatWindow::loginFailed(const QString &reason)
{
    // the server rejected the login attempt
    // display the reason for the rejection in a message box
    QMessageBox::critical(this, tr("Error"), reason);
    // allow the user to retry, execute the same slot as when just connected
    connectedToServer();
}